

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall YAML::Scanner::Scanner(Scanner *this,istream *in)

{
  long in_RDI;
  stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
  *this_00;
  istream *in_stack_00000028;
  Stream *in_stack_00000030;
  stack<YAML::Scanner::IndentMarker_*,_std::deque<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>_>
  *in_stack_ffffffffffffffb0;
  
  YAML::Stream::Stream(in_stack_00000030,in_stack_00000028);
  std::queue<YAML::Token,std::deque<YAML::Token,std::allocator<YAML::Token>>>::
  queue<std::deque<YAML::Token,std::allocator<YAML::Token>>,void>
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             in_stack_ffffffffffffffb0);
  *(undefined1 *)(in_RDI + 0xd0) = 0;
  *(undefined1 *)(in_RDI + 0xd1) = 0;
  *(undefined1 *)(in_RDI + 0xd2) = 0;
  *(undefined1 *)(in_RDI + 0xd3) = 0;
  std::
  stack<YAML::Scanner::SimpleKey,std::deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>>>
  ::stack<std::deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>>,void>
            ((stack<YAML::Scanner::SimpleKey,_std::deque<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>_>
              *)in_stack_ffffffffffffffb0);
  std::
  stack<YAML::Scanner::IndentMarker*,std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>>
  ::
  stack<std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>,void>
            (in_stack_ffffffffffffffb0);
  this_00 = (stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
             *)(in_RDI + 0x178);
  ptr_vector<YAML::Scanner::IndentMarker>::ptr_vector
            ((ptr_vector<YAML::Scanner::IndentMarker> *)this_00);
  std::
  stack<YAML::Scanner::FLOW_MARKER,std::deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>>>
  ::stack<std::deque<YAML::Scanner::FLOW_MARKER,std::allocator<YAML::Scanner::FLOW_MARKER>>,void>
            (this_00);
  return;
}

Assistant:

Scanner::Scanner(std::istream& in)
    : INPUT(in),
      m_tokens{},
      m_startedStream(false),
      m_endedStream(false),
      m_simpleKeyAllowed(false),
      m_canBeJSONFlow(false),
      m_simpleKeys{},
      m_indents{},
      m_indentRefs{},
      m_flows{} {}